

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Vector3f __thiscall pbrt::OctahedralVector::operator_cast_to_Vector3(OctahedralVector *this)

{
  bool bVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Tuple3<pbrt::Vector3,_float> TVar10;
  Tuple3<pbrt::Vector3,_float> local_10;
  
  auVar2 = vpmovzxwd_avx(ZEXT416((uint)*this));
  auVar2 = vcvtdq2ps_avx(auVar2);
  auVar5._8_4_ = 0x477fff00;
  auVar5._0_8_ = 0x477fff00477fff00;
  auVar5._12_4_ = 0x477fff00;
  auVar5 = vdivps_avx512vl(auVar2,auVar5);
  auVar8._8_4_ = 0x40000000;
  auVar8._0_8_ = 0x4000000040000000;
  auVar8._12_4_ = 0x40000000;
  auVar2._8_4_ = 0xbf800000;
  auVar2._0_8_ = 0xbf800000bf800000;
  auVar2._12_4_ = 0xbf800000;
  auVar5 = vfmadd213ps_avx512vl(auVar8,auVar5,auVar2);
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar6 = vandps_avx512vl(auVar5,auVar6);
  local_10._0_8_ = vmovlps_avx(auVar5);
  auVar2 = vhaddps_avx(auVar6,auVar6);
  local_10.z = 1.0 - auVar2._0_4_;
  if (local_10.z < 0.0) {
    auVar9._8_4_ = 0x3f800000;
    auVar9._0_8_ = 0x3f8000003f800000;
    auVar9._12_4_ = 0x3f800000;
    auVar2 = vshufps_avx(auVar6,auVar6,0xe1);
    auVar2 = vsubps_avx(auVar9,auVar2);
    uVar3 = vcmpps_avx512vl(auVar5,ZEXT816(0),1);
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar5 = vxorps_avx512vl(auVar2,auVar4);
    bVar1 = (bool)((byte)uVar3 & 1);
    auVar7._0_4_ = (uint)bVar1 * auVar5._0_4_ | (uint)!bVar1 * auVar2._0_4_;
    bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
    auVar7._4_4_ = (uint)bVar1 * auVar5._4_4_ | (uint)!bVar1 * auVar2._4_4_;
    bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
    auVar7._8_4_ = (uint)bVar1 * auVar5._8_4_ | (uint)!bVar1 * auVar2._8_4_;
    bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
    auVar7._12_4_ = (uint)bVar1 * auVar5._12_4_ | (uint)!bVar1 * auVar2._12_4_;
    local_10._0_8_ = vmovlps_avx(auVar7);
  }
  TVar10 = (Tuple3<pbrt::Vector3,_float>)Normalize<float>((Vector3<float> *)&local_10);
  return (Vector3f)TVar10;
}

Assistant:

operator Vector3f() const {
        Vector3f v;
        v.x = -1 + 2 * (x / 65535.f);
        v.y = -1 + 2 * (y / 65535.f);
        v.z = 1 - (std::abs(v.x) + std::abs(v.y));
        // Reparameterize directions in the $z<0$ portion of the octahedron
        if (v.z < 0) {
            Float xo = v.x;
            v.x = (1 - std::abs(v.y)) * SignNotZero(xo);
            v.y = (1 - std::abs(xo)) * SignNotZero(v.y);
        }

        return Normalize(v);
    }